

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  undefined1 uVar1;
  int iVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiTableColumnSortSpecs *__dest;
  ImGuiTableColumnSortSpecs *pIVar4;
  long lVar5;
  char cVar6;
  short sVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  
  TableSortSpecsSanitize(table);
  iVar2 = (table->SortSpecsMulti).Capacity;
  uVar1 = table->SortSpecsCount;
  cVar6 = '\0';
  if ('\x01' < (char)uVar1) {
    cVar6 = uVar1;
  }
  iVar8 = (int)cVar6;
  if (iVar2 < iVar8) {
    if (iVar2 == 0) {
      iVar11 = 8;
    }
    else {
      iVar11 = iVar2 / 2 + iVar2;
    }
    if (iVar11 <= iVar8) {
      iVar11 = iVar8;
    }
    if (iVar2 < iVar11) {
      __dest = (ImGuiTableColumnSortSpecs *)MemAlloc((long)iVar11 * 0xc);
      pIVar4 = (table->SortSpecsMulti).Data;
      if (pIVar4 != (ImGuiTableColumnSortSpecs *)0x0) {
        memcpy(__dest,pIVar4,(long)(table->SortSpecsMulti).Size * 0xc);
        MemFree((table->SortSpecsMulti).Data);
      }
      (table->SortSpecsMulti).Data = __dest;
      (table->SortSpecsMulti).Capacity = iVar11;
    }
  }
  (table->SortSpecsMulti).Size = iVar8;
  if (table->SortSpecsCount == '\0') {
    pIVar4 = (ImGuiTableColumnSortSpecs *)0x0;
  }
  else if (table->SortSpecsCount == '\x01') {
    pIVar4 = &table->SortSpecsSingle;
  }
  else {
    pIVar4 = (table->SortSpecsMulti).Data;
  }
  if (0 < table->ColumnsCount) {
    lVar5 = 100;
    sVar7 = 0;
    lVar9 = 0;
    do {
      pIVar3 = (table->Columns).Data;
      cVar6 = *(char *)((long)pIVar3 + lVar5 + -0xe);
      lVar10 = (long)cVar6;
      if (lVar10 != -1) {
        pIVar4[lVar10].ColumnUserID = *(ImGuiID *)((long)pIVar3 + lVar5 + -0x34);
        pIVar4[lVar10].ColumnIndex = (short)(char)((ushort)sVar7 >> 8);
        pIVar4[lVar10].SortOrder = (short)cVar6;
        pIVar4[lVar10].field_0x8 = *(byte *)((long)&pIVar3->Flags + lVar5) & 3;
      }
      lVar9 = lVar9 + 1;
      sVar7 = sVar7 + 0x100;
      lVar5 = lVar5 + 0x68;
    } while (lVar9 < table->ColumnsCount);
  }
  (table->SortSpecs).Specs = pIVar4;
  (table->SortSpecs).SpecsCount = (int)table->SortSpecsCount;
  (table->SortSpecs).SpecsDirty = true;
  table->IsSortSpecsDirty = false;
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    IM_ASSERT(table->IsSortSpecsDirty);
    TableSortSpecsSanitize(table);

    // Write output
    table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->SortOrder == -1)
            continue;
        IM_ASSERT(column->SortOrder < table->SortSpecsCount);
        ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
        sort_spec->ColumnUserID = column->UserID;
        sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
        sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
        sort_spec->SortDirection = column->SortDirection;
    }
    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
    table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
    table->IsSortSpecsDirty = false; // Mark as not dirty for us
}